

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,TOIFactoredRewardDecPOMDPDiscrete *o)

{
  E *this_00;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  *(undefined ***)&this->field_0x2d8 = &PTR__POSGInterface_0060e508;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x2d8,&PTR_PTR_0060cdf0);
  *(undefined8 *)&this->field_0x2e0 = 0x60e6f0;
  *(undefined8 *)&this->field_0x2d8 = 0x60e8a0;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x2d8,&PTR_construction_vtable_232__0060cdc8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"received unspec. by TOIDecPOMDPDiscrete",&local_81);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"received unspec. by TOIDecPOMDPDiscrete",&local_82);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"received unspec. by TOIDecPOMDPDiscrete",&local_83);
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__0060cd18,&local_40,
             &local_60,&local_80,false);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x60c560;
  *(undefined8 *)&this->field_0x2d8 = 0x60c940;
  *(undefined8 *)&this->field_0x2e0 = 0x60cb98;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x60c7b8;
  *(undefined8 *)&this->field_0x2d0 = 0;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"TOIFactoredRewardDecPOMDPDiscrete: copy ctor not yet implemented");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(const TOIFactoredRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOIFactoredRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}